

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

plink * Plink_new(void)

{
  char cVar1;
  char *__s;
  plink *ppVar2;
  plink *ppVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  plink *ppVar8;
  FILE *pFVar9;
  char *__modes;
  char *pcVar10;
  char *suffix;
  long lVar11;
  lemon *lemp;
  int iVar12;
  
  if (plink_freelist == (plink *)0x0) {
    lVar11 = 100;
    pcVar10 = (char *)0x10;
    ppVar3 = (plink *)calloc(100,0x10);
    plink_freelist = ppVar3;
    if (ppVar3 == (plink *)0x0) {
      Plink_new_cold_1();
      __s = outputDir;
      pcVar7 = *(char **)(lVar11 + 0xe0);
      suffix = pcVar10;
      if (outputDir != (char *)0x0) {
        suffix = (char *)0x2f;
        pcVar4 = strrchr(pcVar7,0x2f);
        if (pcVar4 != (char *)0x0) {
          pcVar7 = pcVar4 + 1;
        }
      }
      sVar5 = strlen(pcVar7);
      sVar6 = strlen(pcVar10);
      iVar12 = (int)sVar6 + (int)sVar5;
      if (__s != (char *)0x0) {
        sVar5 = strlen(__s);
        iVar12 = iVar12 + (int)sVar5 + 1;
      }
      lemp = (lemon *)(long)(iVar12 + 5);
      ppVar3 = (plink *)malloc((size_t)lemp);
      if (ppVar3 == (plink *)0x0) {
        file_makename_cold_1();
        if (lemp->outname != (char *)0x0) {
          free(lemp->outname);
        }
        pcVar10 = file_makename(lemp,suffix);
        lemp->outname = pcVar10;
        pFVar9 = fopen(pcVar10,__modes);
        if ((pFVar9 == (FILE *)0x0) && (*__modes == 'w')) {
          file_open_cold_1();
          pFVar9 = (FILE *)0x0;
        }
        return (plink *)pFVar9;
      }
      *(char *)&ppVar3->cfp = '\0';
      ppVar2 = ppVar3;
      if (__s != (char *)0x0) {
        lVar11 = 0;
        do {
          cVar1 = __s[lVar11];
          *(char *)((long)&ppVar3->cfp + lVar11) = cVar1;
          lVar11 = lVar11 + 1;
        } while (cVar1 != '\0');
        do {
          ppVar8 = ppVar2;
          ppVar2 = (plink *)((long)&ppVar8->cfp + 1);
        } while (*(char *)&ppVar8->cfp != '\0');
        *(undefined2 *)&ppVar8->cfp = 0x2f;
        ppVar2 = ppVar3;
      }
      do {
        ppVar8 = ppVar2;
        ppVar2 = (plink *)((long)&ppVar8->cfp + 1);
      } while (*(char *)&ppVar8->cfp != '\0');
      lVar11 = 0;
      do {
        cVar1 = pcVar7[lVar11];
        *(char *)((long)&ppVar8->cfp + lVar11) = cVar1;
        lVar11 = lVar11 + 1;
      } while (cVar1 != '\0');
      pcVar7 = strrchr((char *)ppVar3,0x2e);
      ppVar2 = ppVar3;
      if (pcVar7 != (char *)0x0) {
        *pcVar7 = '\0';
      }
      do {
        ppVar8 = ppVar2;
        ppVar2 = (plink *)((long)&ppVar8->cfp + 1);
      } while (*(char *)&ppVar8->cfp != '\0');
      lVar11 = 0;
      do {
        cVar1 = pcVar10[lVar11];
        *(char *)((long)&ppVar8->cfp + lVar11) = cVar1;
        lVar11 = lVar11 + 1;
      } while (cVar1 != '\0');
      return ppVar3;
    }
    lVar11 = 99;
    ppVar2 = ppVar3;
    do {
      ppVar2->next = ppVar2 + 1;
      lVar11 = lVar11 + -1;
      ppVar2 = ppVar2 + 1;
    } while (lVar11 != 0);
    ppVar3[99].next = (plink *)0x0;
  }
  ppVar3 = plink_freelist;
  plink_freelist = plink_freelist->next;
  return ppVar3;
}

Assistant:

struct plink *Plink_new(void){
  struct plink *newlink;

  if( plink_freelist==0 ){
    int i;
    int amt = 100;
    plink_freelist = (struct plink *)calloc( amt, sizeof(struct plink) );
    if( plink_freelist==0 ){
      fprintf(stderr,
      "Unable to allocate memory for a new follow-set propagation link.\n");
      exit(1);
    }
    for(i=0; i<amt-1; i++) plink_freelist[i].next = &plink_freelist[i+1];
    plink_freelist[amt-1].next = 0;
  }
  newlink = plink_freelist;
  plink_freelist = plink_freelist->next;
  return newlink;
}